

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O0

void lws_cancel_service(lws_context *context)

{
  short local_1a;
  lws_context_per_thread *plStack_18;
  short m;
  lws_context_per_thread *pt;
  lws_context *context_local;
  
  plStack_18 = context->pt;
  local_1a = context->count_threads;
  if ((*(ushort *)&context->field_0x510 >> 3 & 1) == 0) {
    _lws_log(8,"%s\n","lws_cancel_service");
    while (local_1a != 0) {
      if (plStack_18->pipe_wsi != (lws *)0x0) {
        lws_plat_pipe_signal(plStack_18->pipe_wsi);
      }
      plStack_18 = plStack_18 + 1;
      local_1a = local_1a + -1;
    }
  }
  return;
}

Assistant:

void
lws_cancel_service(struct lws_context *context)
{
	struct lws_context_per_thread *pt = &context->pt[0];
	short m = context->count_threads;

	if (context->being_destroyed1)
		return;

	lwsl_info("%s\n", __func__);

	while (m--) {
		if (pt->pipe_wsi)
			lws_plat_pipe_signal(pt->pipe_wsi);
		pt++;
	}
}